

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O3

void __thiscall luna::Lexer::LexNewLine(Lexer *this)

{
  int iVar1;
  
  iVar1 = Next(this);
  if (((iVar1 == 0xd) || (iVar1 == 10)) && (iVar1 != this->current_)) {
    iVar1 = Next(this);
  }
  this->current_ = iVar1;
  this->line_ = this->line_ + 1;
  this->column_ = 0;
  return;
}

Assistant:

void Lexer::LexNewLine()
    {
        int next = Next();
        if ((next == '\r' || next == '\n') && next != current_)
            current_ = Next();
        else
            current_ = next;
        ++line_;
        column_ = 0;
    }